

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quirrel_static_analyzer.cpp
# Opt level: O0

string * settings::search_sqconfig_abi_cxx11_(char *initial_file_name)

{
  __type _Var1;
  int iVar2;
  char *__filename;
  FILE *__stream;
  ulong uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  string *in_RDI;
  FILE *f;
  int i;
  string bckDir;
  string fileName;
  string dir;
  char *slash;
  char *slash2;
  char *slash1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffea0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffea8;
  char *local_150;
  allocator local_119;
  string local_118 [32];
  string local_f8 [32];
  string local_d8 [32];
  FILE *local_b8;
  int local_ac;
  string local_a8 [32];
  string local_88 [32];
  undefined4 local_68;
  byte local_64;
  allocator local_63;
  byte local_62;
  undefined1 local_61 [33];
  char *local_40;
  char *local_38;
  char *local_30;
  allocator local_26;
  allocator local_25 [20];
  allocator local_11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_10;
  
  if (in_RSI == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"",&local_11);
    std::allocator<char>::~allocator((allocator<char> *)&local_11);
  }
  else {
    local_10 = in_RSI;
    if ((search_sqconfig[abi:cxx11](char_const*)::cachedDir_abi_cxx11_ == '\0') &&
       (iVar2 = __cxa_guard_acquire(&search_sqconfig[abi:cxx11](char_const*)::cachedDir_abi_cxx11_),
       iVar2 != 0)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&search_sqconfig[abi:cxx11](char_const*)::cachedDir_abi_cxx11_,"?",
                 local_25);
      std::allocator<char>::~allocator((allocator<char> *)local_25);
      __cxa_atexit(std::__cxx11::string::~string,
                   &search_sqconfig[abi:cxx11](char_const*)::cachedDir_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&search_sqconfig[abi:cxx11](char_const*)::cachedDir_abi_cxx11_);
    }
    if ((search_sqconfig[abi:cxx11](char_const*)::cachedFileName_abi_cxx11_ == '\0') &&
       (iVar2 = __cxa_guard_acquire(&search_sqconfig[abi:cxx11](char_const*)::
                                     cachedFileName_abi_cxx11_), iVar2 != 0)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&search_sqconfig[abi:cxx11](char_const*)::cachedFileName_abi_cxx11_,"?",
                 &local_26);
      std::allocator<char>::~allocator((allocator<char> *)&local_26);
      __cxa_atexit(std::__cxx11::string::~string,
                   &search_sqconfig[abi:cxx11](char_const*)::cachedFileName_abi_cxx11_,&__dso_handle
                  );
      __cxa_guard_release(&search_sqconfig[abi:cxx11](char_const*)::cachedFileName_abi_cxx11_);
    }
    local_30 = strrchr((char *)local_10,0x5c);
    local_38 = strrchr((char *)local_10,0x2f);
    local_150 = local_38;
    if (local_38 < local_30) {
      local_150 = local_30;
    }
    local_40 = local_150;
    local_62 = 0;
    local_64 = 0;
    if (local_150 == (char *)0x0) {
      std::allocator<char>::allocator();
      local_64 = 1;
      std::__cxx11::string::string((string *)(local_61 + 1),"",&local_63);
    }
    else {
      in_stack_fffffffffffffea0 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (local_150 + (1 - (long)local_10));
      in_stack_fffffffffffffea8 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_61;
      std::allocator<char>::allocator();
      local_62 = 1;
      std::__cxx11::string::string
                ((string *)(local_61 + 1),(char *)local_10,(ulong)in_stack_fffffffffffffea0,
                 (allocator *)in_stack_fffffffffffffea8);
      in_stack_fffffffffffffe98 = local_10;
    }
    if ((local_64 & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)&local_63);
    }
    if ((local_62 & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)local_61);
    }
    _Var1 = std::operator==(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    if (_Var1) {
      std::__cxx11::string::string
                ((string *)in_RDI,
                 (string *)&search_sqconfig[abi:cxx11](char_const*)::cachedFileName_abi_cxx11_);
      local_68 = 1;
    }
    else {
      std::__cxx11::string::string(local_88);
      std::__cxx11::string::string(local_a8,(string *)(local_61 + 1));
      for (local_ac = 0; local_ac < 0x10; local_ac = local_ac + 1) {
        std::operator+(in_stack_fffffffffffffea8,(char *)in_stack_fffffffffffffea0);
        __filename = (char *)std::__cxx11::string::c_str();
        __stream = fopen(__filename,"rt");
        std::__cxx11::string::~string(local_d8);
        local_b8 = __stream;
        if (__stream != (FILE *)0x0) {
          fclose(__stream);
          std::operator+(in_stack_fffffffffffffea8,(char *)in_stack_fffffffffffffea0);
          std::__cxx11::string::operator=(local_88,local_f8);
          std::__cxx11::string::~string(local_f8);
          break;
        }
        std::operator+(in_stack_fffffffffffffea8,(char *)in_stack_fffffffffffffea0);
        std::__cxx11::string::operator=(local_a8,local_118);
        std::__cxx11::string::~string(local_118);
      }
      uVar3 = std::__cxx11::string::empty();
      if ((uVar3 & 1) == 0) {
        std::__cxx11::string::operator=
                  ((string *)&search_sqconfig[abi:cxx11](char_const*)::cachedDir_abi_cxx11_,
                   (string *)(local_61 + 1));
        std::__cxx11::string::operator=
                  ((string *)&search_sqconfig[abi:cxx11](char_const*)::cachedFileName_abi_cxx11_,
                   local_88);
        std::__cxx11::string::string((string *)in_RDI,local_88);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)in_RDI,"",&local_119);
        std::allocator<char>::~allocator((allocator<char> *)&local_119);
      }
      local_68 = 1;
      std::__cxx11::string::~string(local_a8);
      std::__cxx11::string::~string(local_88);
    }
    std::__cxx11::string::~string((string *)(local_61 + 1));
  }
  return in_RDI;
}

Assistant:

string search_sqconfig(const char * initial_file_name)
  {
    if (!initial_file_name)
      return string("");

    static string cachedDir = "?";
    static string cachedFileName = "?";
    const char * slash1 = strrchr(initial_file_name, '\\');
    const char * slash2 = strrchr(initial_file_name, '/');
    const char * slash = slash1 > slash2 ? slash1 : slash2;
    string dir = slash ? string(initial_file_name, slash - initial_file_name + 1) : string("");
    if (dir == cachedDir)
      return cachedFileName;

    string fileName;
    string bckDir = dir;
    for (int i = 0; i < 16; i++)
    {
      if (FILE * f = fopen((bckDir + ".sqconfig").c_str(), "rt"))
      {
        fclose(f);
        fileName = bckDir + ".sqconfig";
        break;
      }
      bckDir = bckDir + "../";
    }

    if (fileName.empty())
      return string("");

    cachedDir = dir;
    cachedFileName = fileName;
    return fileName;
  }